

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O2

DBInfo __thiscall Clasp::Solver::reduceLinear(Solver *this,uint32 maxR,CmpScore *sc)

{
  Constraint *pCVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  uint uVar5;
  size_type i;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  size_type i_1;
  uint uVar9;
  undefined1 auVar10 [16];
  DBInfo DVar11;
  ScoreType a;
  uint32 local_64;
  uint32 local_60;
  ConstraintScore local_5c;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  ConstraintScore local_34;
  
  lVar7 = 0;
  for (uVar8 = 0; (size_type)uVar8 != (this->learnts_).ebo_.size;
      uVar8 = (ulong)((size_type)uVar8 + 1)) {
    local_5c.rep = (*(this->learnts_).ebo_.buf[uVar8]->_vptr_Constraint[0xc])();
    uVar3 = CmpScore::score(sc,&local_5c);
    lVar7 = lVar7 + (ulong)uVar3;
  }
  auVar10._8_4_ = (int)((ulong)lVar7 >> 0x20);
  auVar10._0_8_ = lVar7;
  auVar10._12_4_ = 0x45300000;
  dStack_50 = auVar10._8_8_ - 1.9342813113834067e+25;
  local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
  local_48 = (local_58 / (double)uVar8) * 1.5;
  local_34.rep = 0x1fffff;
  dStack_40 = dStack_50;
  uVar3 = CmpScore::score(sc,&local_34);
  if ((double)uVar3 < local_48) {
    local_48 = (local_58 / (double)(this->learnts_).ebo_.size + (double)uVar3) * 0.5;
    dStack_40 = dStack_50;
  }
  uVar9 = 0;
  local_60 = 0;
  local_58 = 0.0;
  uVar6 = 0;
  local_64 = maxR;
  do {
    uVar8 = (ulong)uVar6;
    if (uVar9 == (this->learnts_).ebo_.size) {
      uVar8 = uVar8 | (long)local_58 << 0x20;
      DVar11.pinned = local_60;
      DVar11.size = (int)uVar8;
      DVar11.locked = (int)(uVar8 >> 0x20);
      return DVar11;
    }
    pCVar1 = (this->learnts_).ebo_.buf[uVar9];
    a.rep = (*pCVar1->_vptr_Constraint[0xc])(pCVar1);
    uVar4 = (*pCVar1->_vptr_Constraint[0xb])(pCVar1,this);
    uVar3 = CmpScore::score(sc,&a);
    bVar2 = true;
    if ((double)uVar3 <= local_48) {
      uVar5 = a.rep >> 0x14 & 0x7f;
      if ((a.rep & 0x7f00000) == 0) {
        uVar5 = 0x7f;
      }
      bVar2 = uVar5 <= sc->glue;
      if ((local_64 == 0 || (char)uVar4 != '\0') || (uVar5 <= sc->glue)) goto LAB_00165bf8;
      bVar2 = CmpScore::isFrozen(sc,&a);
      if (bVar2) {
        bVar2 = false;
        goto LAB_00165bf8;
      }
      local_64 = local_64 - 1;
      (*pCVar1->_vptr_Constraint[5])(pCVar1,this,1);
    }
    else {
LAB_00165bf8:
      local_60 = local_60 + bVar2;
      local_58 = (double)(ulong)(SUB84(local_58,0) + (uVar4 & 0xff));
      uVar6 = uVar6 + 1;
      (this->learnts_).ebo_.buf[uVar8] = pCVar1;
      (*pCVar1->_vptr_Constraint[0xd])(pCVar1);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

Solver::DBInfo Solver::reduceLinear(uint32 maxR, const CmpScore& sc) {
	// compute average activity
	uint64 scoreSum = 0;
	for (LitVec::size_type i = 0; i != learnts_.size(); ++i) {
		scoreSum += sc.score(learnts_[i]->activity());
	}
	double avgAct = (scoreSum / (double) numLearntConstraints());
	// constraints with score > 1.5 times the average are "active"
	double scoreThresh = avgAct * 1.5;
	double scoreMax    = (double)sc.score(makeScore(Clasp::ACT_MAX, 1));
	if (scoreThresh > scoreMax) {
		scoreThresh = (scoreMax + (scoreSum / (double) numLearntConstraints())) / 2.0;
	}
	// remove up to maxR constraints but keep "active" and locked once
	DBInfo res = {0,0,0};
	typedef ConstraintScore ScoreType;
	for (LitVec::size_type i = 0; i != learnts_.size(); ++i) {
		Constraint* c = learnts_[i];
		ScoreType a   = c->activity();
		bool isLocked = c->locked(*this);
		bool isGlue   = sc.score(a) > scoreThresh || sc.isGlue(a);
		if (maxR == 0 || isLocked || isGlue || sc.isFrozen(a)) {
			res.pinned += isGlue;
			res.locked += isLocked;
			learnts_[res.size++] = c;
			c->decreaseActivity();
		}
		else {
			--maxR;
			c->destroy(this, true);
		}
	}
	return res;
}